

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O1

int __thiscall font2svg::glyph::init(glyph *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *this_00;
  FT_Face_conflict pFVar1;
  FT_GlyphSlot_conflict pFVar2;
  FT_Vector *pFVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  FT_Pos FVar10;
  FT_Pos FVar11;
  FT_Pos FVar12;
  FT_Pos FVar13;
  FT_Pos FVar14;
  FT_Pos FVar15;
  FT_Pos FVar16;
  short *psVar17;
  short sVar18;
  short sVar19;
  undefined4 uVar20;
  FT_Error FVar21;
  long lVar22;
  ostream *poVar23;
  size_t sVar24;
  long *extraout_RAX;
  long *plVar25;
  long lVar26;
  char glyph_name [1024];
  long *local_448;
  long local_440;
  long local_438 [2];
  char local_428 [1024];
  
  this->face = (this->file).face;
  lVar22 = strtol(*(char **)ctx,(char **)0x0,0);
  this->codepoint = (int)lVar22;
  uVar20 = FT_Get_Char_Index(this->face,(long)(int)lVar22);
  this_00 = &this->field_0xe8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"<!--\nUnicode requested: ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,*(char **)ctx,*(long *)(ctx + 8));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," (decimal: ",0xb);
  poVar23 = (ostream *)std::ostream::operator<<((ostream *)this_00,this->codepoint);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23," hex: 0x",8);
  *(uint *)(poVar23 + *(long *)(*(long *)poVar23 + -0x18) + 0x18) =
       *(uint *)(poVar23 + *(long *)(*(long *)poVar23 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar23 = (ostream *)std::ostream::operator<<(poVar23,this->codepoint);
  *(uint *)(poVar23 + *(long *)(*(long *)poVar23 + -0x18) + 0x18) =
       *(uint *)(poVar23 + *(long *)(*(long *)poVar23 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar23,")",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nGlyph index for unicode: ",0x1a);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  FVar21 = FT_Load_Glyph(this->face,uVar20,1);
  this->error = FVar21;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nLoad Glyph into Face\'s glyph slot. error code: ",0x30);
  std::ostream::operator<<((ostream *)this_00,this->error);
  pFVar1 = this->face;
  pFVar2 = pFVar1->glyph;
  this->slot = pFVar2;
  uVar4 = *(undefined4 *)&(pFVar2->outline).field_0x24;
  (this->ftoutline).flags = (pFVar2->outline).flags;
  *(undefined4 *)&(this->ftoutline).field_0x24 = uVar4;
  sVar18 = (pFVar2->outline).n_contours;
  sVar19 = (pFVar2->outline).n_points;
  uVar4 = *(undefined4 *)&(pFVar2->outline).field_0x4;
  uVar5 = *(undefined4 *)&(pFVar2->outline).points;
  uVar6 = *(undefined4 *)((long)&(pFVar2->outline).points + 4);
  uVar7 = *(undefined4 *)((long)&(pFVar2->outline).tags + 4);
  uVar8 = *(undefined4 *)&(pFVar2->outline).contours;
  uVar9 = *(undefined4 *)((long)&(pFVar2->outline).contours + 4);
  *(undefined4 *)&(this->ftoutline).tags = *(undefined4 *)&(pFVar2->outline).tags;
  *(undefined4 *)((long)&(this->ftoutline).tags + 4) = uVar7;
  *(undefined4 *)&(this->ftoutline).contours = uVar8;
  *(undefined4 *)((long)&(this->ftoutline).contours + 4) = uVar9;
  (this->ftoutline).n_contours = sVar18;
  (this->ftoutline).n_points = sVar19;
  *(undefined4 *)&(this->ftoutline).field_0x4 = uVar4;
  *(undefined4 *)&(this->ftoutline).points = uVar5;
  *(undefined4 *)((long)&(this->ftoutline).points + 4) = uVar6;
  FT_Get_Glyph_Name(pFVar1,uVar20,local_428,0x400);
  pFVar2 = this->slot;
  FVar10 = (pFVar2->metrics).height;
  FVar11 = (pFVar2->metrics).horiBearingX;
  FVar12 = (pFVar2->metrics).horiBearingY;
  FVar13 = (pFVar2->metrics).horiAdvance;
  FVar14 = (pFVar2->metrics).vertBearingX;
  FVar15 = (pFVar2->metrics).vertBearingY;
  FVar16 = (pFVar2->metrics).vertAdvance;
  (this->gm).width = (pFVar2->metrics).width;
  (this->gm).height = FVar10;
  (this->gm).horiBearingX = FVar11;
  (this->gm).horiBearingY = FVar12;
  (this->gm).horiAdvance = FVar13;
  (this->gm).vertBearingX = FVar14;
  (this->gm).vertBearingY = FVar15;
  (this->gm).vertAdvance = FVar16;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nGlyph Name: ",0xd);
  sVar24 = strlen(local_428);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_428,sVar24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nGlyph Width: ",0xe);
  poVar23 = std::ostream::_M_insert<long>((long)this_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23," Height: ",9);
  poVar23 = std::ostream::_M_insert<long>((long)poVar23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23," Hor. Advance: ",0xf);
  poVar23 = std::ostream::_M_insert<long>((long)poVar23);
  std::__ostream_insert<char,std::char_traits<char>>(poVar23," Vert. Advance: ",0x10);
  std::ostream::_M_insert<long>((long)poVar23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nNum points: ",0xd);
  std::ostream::operator<<((ostream *)this_00,(this->ftoutline).n_points);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nNum contours: ",0xf);
  std::ostream::operator<<((ostream *)this_00,(this->ftoutline).n_contours);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nContour endpoint index values:",0x1f);
  if (0 < (this->ftoutline).n_contours) {
    lVar22 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," ",1);
      std::ostream::operator<<((ostream *)this_00,(this->ftoutline).contours[lVar22]);
      lVar22 = lVar22 + 1;
    } while (lVar22 < (this->ftoutline).n_contours);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n-->\n",5);
  pFVar3 = (this->ftoutline).points;
  this->ftpoints = pFVar3;
  lVar22 = (long)(this->ftoutline).n_points;
  if (0 < lVar22) {
    lVar26 = 0;
    do {
      plVar25 = (long *)((long)&pFVar3->y + lVar26);
      *plVar25 = -*plVar25;
      lVar26 = lVar26 + 0x10;
    } while (lVar22 * 0x10 != lVar26);
  }
  pFVar1 = this->face;
  this->bbheight = (int)(pFVar1->bbox).yMax - (int)(pFVar1->bbox).yMin;
  this->bbwidth = (int)(pFVar1->bbox).xMax - (int)(pFVar1->bbox).xMin;
  psVar17 = (this->ftoutline).contours;
  this->tags = (this->ftoutline).tags;
  this->contours = psVar17;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_448,local_440);
  plVar25 = local_438;
  if (local_448 != plVar25) {
    operator_delete(local_448,local_438[0] + 1);
    plVar25 = extraout_RAX;
  }
  return (int)plVar25;
}

Assistant:

void init( std::string unicode_s )
	{
		face = file.face;
		codepoint = strtol( unicode_s.c_str() , NULL, 0 );
		// Load the Glyph into the face's Glyph Slot + print details
		FT_UInt glyph_index = FT_Get_Char_Index( face, codepoint );
		debug << "<!--\nUnicode requested: " << unicode_s;
		debug << " (decimal: " << codepoint << " hex: 0x"
			<< std::hex << codepoint << std::dec << ")";
		debug << "\nGlyph index for unicode: " << glyph_index;
		error = FT_Load_Glyph( face, glyph_index, FT_LOAD_NO_SCALE );
		debug << "\nLoad Glyph into Face's glyph slot. error code: " << error;
		slot = face->glyph;
		ftoutline = slot->outline;
		char glyph_name[1024];
		FT_Get_Glyph_Name( face, glyph_index, glyph_name, 1024 );
		gm = slot->metrics;
		debug << "\nGlyph Name: " << glyph_name;
		debug << "\nGlyph Width: " << gm.width
			<< " Height: " << gm.height
			<< " Hor. Advance: " << gm.horiAdvance
			<< " Vert. Advance: " << gm.vertAdvance;

		// Print outline details, taken from the glyph in the slot.
		debug << "\nNum points: " << ftoutline.n_points;
		debug << "\nNum contours: " << ftoutline.n_contours;
		debug << "\nContour endpoint index values:";
		for ( int i = 0 ; i < ftoutline.n_contours ; i++ ) debug << " " << ftoutline.contours[i];
		debug << "\n-->\n";

		// Invert y coordinates (SVG = neg at top, TType = neg at bottom)
		ftpoints = ftoutline.points;
		for ( int i = 0 ; i < ftoutline.n_points ; i++ )
			ftpoints[i].y *= -1;

		bbheight = face->bbox.yMax - face->bbox.yMin;
		bbwidth = face->bbox.xMax - face->bbox.xMin;
		tags = ftoutline.tags;
		contours = ftoutline.contours;
		std::cout << debug.str();
	}